

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::ExecuteTests(cmCTest *this)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  int unaff_EBP;
  cmCTestGenericHandler **handler;
  _Alloc_hider _Var6;
  initializer_list<cmCTestGenericHandler_*> __l;
  initializer_list<cmCTestGenericHandler_*> __l_00;
  string currDir;
  string workDir;
  ostringstream cmCTestLog_msg;
  string local_1f8;
  string local_1d8;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  cmCTestTestHandler *local_178;
  cmCTestUpdateHandler *local_170;
  cmCTestConfigureHandler *local_168;
  cmCTestMemCheckHandler *local_160;
  cmCTestSubmitHandler *local_158;
  _Base_ptr local_150;
  undefined1 local_128 [264];
  
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->RunConfigurationScript == true) {
    if ((_Var1._M_head_impl)->ExtraVerbose == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"* Extra verbosity turned on",0x1b);
      std::ios::widen((char)(ostringstream *)local_198 +
                      (char)*(_Base_ptr *)(local_198._0_8_ + -0x18));
      std::ostream::put((char)local_198);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xb37,local_1f8._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)local_128);
    }
    _Var1._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    local_198._0_8_ = &(_Var1._M_head_impl)->BuildHandler;
    local_198._8_8_ = &(_Var1._M_head_impl)->BuildAndTestHandler;
    local_188._M_allocated_capacity = (size_type)&(_Var1._M_head_impl)->CoverageHandler;
    local_188._8_8_ = &(_Var1._M_head_impl)->ScriptHandler;
    local_178 = &(_Var1._M_head_impl)->TestHandler;
    local_170 = &(_Var1._M_head_impl)->UpdateHandler;
    local_168 = &(_Var1._M_head_impl)->ConfigureHandler;
    local_160 = &(_Var1._M_head_impl)->MemCheckHandler;
    local_158 = &(_Var1._M_head_impl)->SubmitHandler;
    local_150 = (_Base_ptr)&(_Var1._M_head_impl)->UploadHandler;
    __l._M_len = 10;
    __l._M_array = (iterator)local_198;
    std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &local_1f8,__l,(allocator_type *)&local_1d8);
    if (local_1f8._M_dataplus._M_p != (pointer)local_1f8._M_string_length) {
      _Var1._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      bVar3 = (_Var1._M_head_impl)->ExtraVerbose;
      iVar4 = (_Var1._M_head_impl)->SubmitIndex;
      _Var6._M_p = local_1f8._M_dataplus._M_p;
      do {
        sVar2 = *(size_type *)_Var6._M_p;
        *(uint *)(sVar2 + 0x18) = (uint)bVar3;
        *(int *)(sVar2 + 0x118) = iVar4;
        _Var6._M_p = _Var6._M_p + 8;
      } while (_Var6._M_p != (pointer)local_1f8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p);
    }
    _Var1._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    *(uint *)((long)&(_Var1._M_head_impl)->ScriptHandler + 0x18) =
         (uint)(_Var1._M_head_impl)->Verbose;
    unaff_EBP = (**(code **)(*(long *)&((_Var1._M_head_impl)->ScriptHandler).
                                       super_cmCTestGenericHandler + 8))
                          (&(_Var1._M_head_impl)->ScriptHandler);
    if (unaff_EBP == 0) {
      unaff_EBP = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"running script failing returning: ",0x22);
      plVar5 = (long *)std::ostream::operator<<(local_198,unaff_EBP);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xb41,local_1f8._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)local_128);
    }
  }
  else {
    (_Var1._M_head_impl)->ExtraVerbose = (_Var1._M_head_impl)->Verbose;
    (_Var1._M_head_impl)->Verbose = true;
    local_198._0_8_ = &(_Var1._M_head_impl)->BuildHandler;
    local_198._8_8_ = &(_Var1._M_head_impl)->BuildAndTestHandler;
    local_188._M_allocated_capacity = (size_type)&(_Var1._M_head_impl)->CoverageHandler;
    local_188._8_8_ = &(_Var1._M_head_impl)->ScriptHandler;
    local_178 = &(_Var1._M_head_impl)->TestHandler;
    local_170 = &(_Var1._M_head_impl)->UpdateHandler;
    local_168 = &(_Var1._M_head_impl)->ConfigureHandler;
    local_160 = &(_Var1._M_head_impl)->MemCheckHandler;
    local_158 = &(_Var1._M_head_impl)->SubmitHandler;
    local_150 = (_Base_ptr)&(_Var1._M_head_impl)->UploadHandler;
    __l_00._M_len = 10;
    __l_00._M_array = (iterator)local_198;
    std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &local_1f8,__l_00,(allocator_type *)&local_1d8);
    if (local_1f8._M_dataplus._M_p != (pointer)local_1f8._M_string_length) {
      _Var1._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      bVar3 = (_Var1._M_head_impl)->Verbose;
      iVar4 = (_Var1._M_head_impl)->SubmitIndex;
      _Var6._M_p = local_1f8._M_dataplus._M_p;
      do {
        sVar2 = *(size_type *)_Var6._M_p;
        *(uint *)(sVar2 + 0x18) = (uint)bVar3;
        *(int *)(sVar2 + 0x118) = iVar4;
        _Var6._M_p = _Var6._M_p + 8;
      } while (_Var6._M_p != (pointer)local_1f8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p);
    }
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,local_1f8._M_dataplus._M_p,
               local_1f8._M_string_length + local_1f8._M_dataplus._M_p);
    _Var1._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (*(size_type *)((long)&(_Var1._M_head_impl)->TestDir + 8) != 0) {
      cmsys::SystemTools::CollapseFullPath((string *)local_198,&(_Var1._M_head_impl)->TestDir);
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_198);
      if ((cmCTestGenericHandler *)local_198._0_8_ != (cmCTestGenericHandler *)&local_188) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_188._M_allocated_capacity + 1));
      }
    }
    if (((local_1f8._M_string_length == local_1d8._M_string_length) &&
        (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0 ||
         (iVar4 = bcmp(local_1f8._M_dataplus._M_p,local_1d8._M_dataplus._M_p,
                       local_1f8._M_string_length), iVar4 == 0)))) ||
       (bVar3 = TryToChangeDirectory(this,&local_1d8), bVar3)) {
      iVar4 = Initialize(this,local_1d8._M_dataplus._M_p,(cmCTestStartCommand *)0x0);
      if (iVar4 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"Problem initializing the dashboard.",0x23);
        std::ios::widen((char)(ostream *)local_198 +
                        (char)(rep)((time_point *)(local_198._0_8_ + -0x18))->__d);
        std::ostream::put((char)local_198);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xb5d,(char *)local_1b8,false);
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
        std::ios_base::~ios_base((ios_base *)local_128);
        unaff_EBP = 0xc;
      }
      else {
        unaff_EBP = ProcessSteps(this);
      }
      if ((local_1f8._M_string_length != local_1d8._M_string_length) ||
         ((bVar3 = true,
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0 && (iVar4 = bcmp(local_1f8._M_dataplus._M_p,local_1d8._M_dataplus._M_p,
                                  local_1f8._M_string_length), iVar4 != 0)))) {
        bVar3 = true;
        cmsys::SystemTools::ChangeDirectory(&local_1f8);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      return 1;
    }
  }
  if (unaff_EBP != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Running a test(s) failed returning : ",0x25);
    plVar5 = (long *)std::ostream::operator<<(local_198,unaff_EBP);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xb69,local_1f8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)local_128);
  }
  return unaff_EBP;
}

Assistant:

int cmCTest::ExecuteTests()
{
  int res;
  // call process directory
  if (this->Impl->RunConfigurationScript) {
    if (this->Impl->ExtraVerbose) {
      cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
    }
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      handler->SetVerbose(this->Impl->ExtraVerbose);
      handler->SetSubmitIndex(this->Impl->SubmitIndex);
    }
    this->GetScriptHandler()->SetVerbose(this->Impl->Verbose);
    res = this->GetScriptHandler()->ProcessHandler();
    if (res != 0) {
      cmCTestLog(this, DEBUG,
                 "running script failing returning: " << res << std::endl);
    }

  } else {
    // What is this?  -V seems to be the same as -VV,
    // and Verbose is always on in this case
    this->Impl->ExtraVerbose = this->Impl->Verbose;
    this->Impl->Verbose = true;
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      handler->SetVerbose(this->Impl->Verbose);
      handler->SetSubmitIndex(this->Impl->SubmitIndex);
    }

    const std::string currDir = cmSystemTools::GetCurrentWorkingDirectory();
    std::string workDir = currDir;
    if (!this->Impl->TestDir.empty()) {
      workDir = cmSystemTools::CollapseFullPath(this->Impl->TestDir);
    }

    if (currDir != workDir) {
      if (!this->TryToChangeDirectory(workDir)) {
        return 1;
      }
    }

    if (!this->Initialize(workDir.c_str(), nullptr)) {
      res = 12;
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem initializing the dashboard." << std::endl);
    } else {
      res = this->ProcessSteps();
    }
    this->Finalize();

    if (currDir != workDir) {
      cmSystemTools::ChangeDirectory(currDir);
    }
  }
  if (res != 0) {
    cmCTestLog(this, DEBUG,
               "Running a test(s) failed returning : " << res << std::endl);
  }
  return res;
}